

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O1

void __thiscall
helics::BaseTimeCoordinator::enteringExecMode(BaseTimeCoordinator *this,IterationRequest param_1)

{
  ConnectionType CVar1;
  int iVar2;
  pointer pDVar3;
  pointer pDVar4;
  _Alloc_hider __src;
  bool bVar5;
  bool bVar6;
  pointer pDVar7;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> res;
  ActionMessage error;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  ActionMessage local_d8;
  
  if (this->executionMode == false) {
    this->checkingExec = true;
    if ((this->dependencies).dependencies.
        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->dependencies).dependencies.
        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      (*this->_vptr_BaseTimeCoordinator[2])(this);
      TimeDependencies::checkForIssues_abi_cxx11_(&local_100,&this->dependencies,false);
      iVar2 = local_100.first;
      if (local_100.first != 0) {
        ActionMessage::ActionMessage(&local_d8,cmd_global_error);
        __src._M_p = local_100.second._M_dataplus._M_p;
        local_d8.dest_id.gid = 0;
        local_d8.source_id.gid = (this->mSourceId).gid;
        local_d8.messageID = local_100.first;
        if ((byte *)local_100.second._M_dataplus._M_p == local_d8.payload.heap) {
          local_d8.payload.bufferSize = local_100.second._M_string_length;
        }
        else {
          SmallBuffer::reserve(&local_d8.payload,local_100.second._M_string_length);
          local_d8.payload.bufferSize = local_100.second._M_string_length;
          if (local_100.second._M_string_length != 0) {
            memcpy(local_d8.payload.heap,__src._M_p,local_100.second._M_string_length);
          }
        }
        if ((this->sendMessageFunction).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(this->sendMessageFunction)._M_invoker)((_Any_data *)&this->sendMessageFunction,&local_d8)
        ;
        ActionMessage::~ActionMessage(&local_d8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100.second._M_dataplus._M_p != &local_100.second.field_2) {
        operator_delete(local_100.second._M_dataplus._M_p,
                        local_100.second.field_2._M_allocated_capacity + 1);
      }
      if (iVar2 != 0) {
        return;
      }
    }
    this->noParent = true;
    pDVar3 = (this->dependencies).dependencies.
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pDVar4 = (this->dependencies).dependencies.
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pDVar3 == pDVar4) {
      bVar6 = true;
    }
    else {
      bVar5 = true;
      bVar6 = true;
      do {
        pDVar7 = pDVar3 + 1;
        CVar1 = pDVar3->connection;
        if (CVar1 == PARENT) {
          this->noParent = false;
          bVar6 = false;
          bVar5 = false;
        }
        else if (CVar1 == CHILD) {
          iVar2 = (pDVar3->fedID).gid;
          bVar6 = bVar5;
          if (iVar2 == 1) {
            bVar6 = false;
          }
          bVar5 = bVar6;
          if (0x6fffffff < iVar2) {
            bVar5 = false;
            bVar6 = false;
          }
        }
      } while ((CVar1 != PARENT) && (pDVar3 = pDVar7, pDVar7 != pDVar4));
    }
    this->federatesOnly = bVar6;
    sendTimingInfo(this);
  }
  return;
}

Assistant:

void BaseTimeCoordinator::enteringExecMode(IterationRequest /*mode*/)
{
    if (executionMode) {
        return;
    }
    checkingExec = true;
    if (!dependencies.empty()) {
        updateTimeFactors();
        auto res = dependencies.checkForIssues(false);
        if (res.first != 0) {
            ActionMessage error(CMD_GLOBAL_ERROR);
            error.dest_id = parent_broker_id;
            error.source_id = mSourceId;
            error.messageID = res.first;
            error.payload = res.second;
            sendMessageFunction(error);
            return;
        }
    }
    bool fedOnly = true;
    noParent = true;
    for (const auto& dep : dependencies) {
        if (dep.connection == ConnectionType::PARENT) {
            fedOnly = false;
            noParent = false;
            break;
        }
        if (dep.connection == ConnectionType::CHILD && dep.fedID.isBroker()) {
            fedOnly = false;
        }
    }
    federatesOnly = fedOnly;
    sendTimingInfo();
}